

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

float32 diag_norm(vector_t var,uint32 len)

{
  ulong uVar1;
  float fVar2;
  double dVar3;
  
  uVar1 = 0;
  fVar2 = 0.0;
  while( true ) {
    if (len == uVar1) {
      return (float32)((fVar2 + (float)((double)len * 1.8378770664093453)) * -0.5);
    }
    if (var[uVar1] <= 0.0) break;
    dVar3 = log((double)var[uVar1]);
    fVar2 = (float)((double)fVar2 + dVar3);
    uVar1 = uVar1 + 1;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
          ,0x152,"Sanity check var[i] > 0 failed: %e\n");
  exit(1);
}

Assistant:

float32
diag_norm(vector_t var,
	  uint32 len)
{
    float32 log_det;
    float32 p;
    uint32 i;

    log_det = 0;

    for (i = 0; i < len; i++) {
	if (var[i] <= 0) {
	    E_FATAL("Sanity check var[i] > 0 failed: %e\n", var[i]);
	}
	log_det += log(var[i]);
    }

    p = len * log(2.0 * M_PI);

    return - 0.5 * (log_det + p);
}